

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPNTDG.cpp
# Opt level: O1

void __thiscall NaPNTrainDataGath::action(NaPNTrainDataGath *this)

{
  NaPetriCnInput *this_00;
  NaPetriCnInput *this_01;
  int *piVar1;
  double *pdVar2;
  double dVar3;
  iterator iVar4;
  pointer pdVar5;
  pointer pdVar6;
  int *piVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  double dVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  int iVar14;
  uint uVar15;
  NaVector *pNVar16;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  NaVector *pNVar17;
  undefined4 extraout_var_02;
  ulong uVar18;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  long lVar19;
  long lVar20;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  char *pcVar21;
  NaPetriNet *pNVar22;
  NaTimer *pNVar23;
  ulong uVar24;
  int iVar25;
  uint in_R11D;
  long lVar26;
  double dVar27;
  undefined1 auVar28 [16];
  double dVar29;
  int iVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  
  if (this->bTurnedOn == true) {
    this_00 = &this->in1;
    pNVar16 = NaPetriCnInput::data(this_00);
    iVar11 = (*pNVar16->_vptr_NaVector[8])(pNVar16,0);
    iVar4._M_current =
         this->par[0].vSeries.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar4._M_current ==
        this->par[0].vSeries.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                ((vector<double,std::allocator<double>> *)&this->par[0].vSeries,iVar4,
                 (double *)CONCAT44(extraout_var,iVar11));
    }
    else {
      *iVar4._M_current = *(double *)CONCAT44(extraout_var,iVar11);
      this->par[0].vSeries.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar4._M_current + 1;
    }
    this_01 = &this->in2;
    pNVar16 = NaPetriCnInput::data(this_01);
    iVar11 = (*pNVar16->_vptr_NaVector[8])(pNVar16,0);
    iVar4._M_current =
         this->par[1].vSeries.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar4._M_current ==
        this->par[1].vSeries.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                ((vector<double,std::allocator<double>> *)&this->par[1].vSeries,iVar4,
                 (double *)CONCAT44(extraout_var_01,iVar11));
    }
    else {
      *iVar4._M_current = *(double *)CONCAT44(extraout_var_01,iVar11);
      this->par[1].vSeries.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar4._M_current + 1;
    }
    pNVar16 = NaPetriCnInput::data(this_00);
    pNVar17 = NaPetriCnOutput::data(&this->out1);
    (*pNVar17->_vptr_NaVector[2])(pNVar17,pNVar16);
    pNVar16 = NaPetriCnInput::data(this_01);
    pNVar17 = NaPetriCnOutput::data(&this->out2);
    (*pNVar17->_vptr_NaVector[2])(pNVar17,pNVar16);
    pNVar16 = NaPetriCnOutput::data(&this->turnoff);
    iVar11 = (*pNVar16->_vptr_NaVector[8])(pNVar16,0);
    *(undefined8 *)CONCAT44(extraout_var_02,iVar11) = 0;
    NaPetriCnOutput::commit_data(&this->out1);
    NaPetriCnOutput::commit_data(&this->out2);
    uVar18 = (long)this->par[0].vSeries.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)this->par[0].vSeries.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3;
    uVar24 = (ulong)this->nStDetLen;
    if (uVar18 < uVar24) {
      pNVar16 = NaPetriCnInput::data(this_00);
      iVar11 = (*pNVar16->_vptr_NaVector[8])(pNVar16,0);
      this->par[0].fSum = *(double *)CONCAT44(extraout_var_03,iVar11) + this->par[0].fSum;
      pNVar16 = NaPetriCnInput::data(this_00);
      iVar11 = (*pNVar16->_vptr_NaVector[8])(pNVar16,0);
      dVar27 = *(double *)CONCAT44(extraout_var_04,iVar11);
      pNVar16 = NaPetriCnInput::data(this_00);
      iVar11 = (*pNVar16->_vptr_NaVector[8])(pNVar16,0);
      this->par[0].fSum2 = dVar27 * *(double *)CONCAT44(extraout_var_05,iVar11) + this->par[0].fSum2
      ;
      pNVar16 = NaPetriCnInput::data(this_01);
      iVar11 = (*pNVar16->_vptr_NaVector[8])(pNVar16,0);
      this->par[1].fSum = *(double *)CONCAT44(extraout_var_06,iVar11) + this->par[1].fSum;
      pNVar16 = NaPetriCnInput::data(this_01);
      iVar11 = (*pNVar16->_vptr_NaVector[8])(pNVar16,0);
      dVar27 = *(double *)CONCAT44(extraout_var_07,iVar11);
      pNVar16 = NaPetriCnInput::data(this_01);
      iVar11 = (*pNVar16->_vptr_NaVector[8])(pNVar16,0);
      this->par[1].fSum2 = dVar27 * *(double *)CONCAT44(extraout_var_08,iVar11) + this->par[1].fSum2
      ;
    }
    else if (uVar18 == uVar24) {
      pcVar21 = NaPetriNode::name(&this->super_NaPetriNode);
      pNVar22 = NaPetriNode::net(&this->super_NaPetriNode);
      pNVar23 = NaPetriNet::timer(pNVar22);
      uVar12 = (*pNVar23->_vptr_NaTimer[5])(pNVar23);
      NaPrintLog("\'%s\' calculated statistics (at %d):\n",pcVar21,(ulong)uVar12);
      lVar26 = 0x2f8;
      do {
        lVar19 = *(long *)((long)&(this->super_NaPetriNode)._vptr_NaPetriNode + lVar26) -
                 *(long *)((long)this + lVar26 + -8);
        lVar20 = lVar19 >> 3;
        auVar28._8_4_ = (int)(lVar19 >> 0x23);
        auVar28._0_8_ = lVar20;
        auVar28._12_4_ = 0x45300000;
        dVar27 = (auVar28._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)lVar20) - 4503599627370496.0);
        dVar29 = *(double *)((long)this + lVar26 + -0x18) / dVar27;
        *(double *)((long)this + lVar26 + -0x38) = dVar29;
        dVar27 = *(double *)((long)this + lVar26 + -0x10) / dVar27 - dVar29 * dVar29;
        if (dVar27 < 0.0) {
          dVar27 = sqrt(dVar27);
        }
        else {
          dVar27 = SQRT(dVar27);
        }
        *(double *)((long)this + lVar26 + -0x30) = dVar27;
        dVar29 = *(double *)((long)this + lVar26 + -0x38);
        dVar3 = *(double *)((long)this + lVar26 + -0x40);
        pdVar2 = (double *)((long)this + lVar26 + -0x28);
        *pdVar2 = dVar29 + dVar27 * -dVar3;
        pdVar2[1] = dVar29 + dVar27 * dVar3;
        NaPrintLog("\taverage=%g\tsigma=%g\trange: %g .. %g\n");
        lVar26 = lVar26 + 0x58;
      } while (lVar26 == 0x350);
      pdVar5 = this->par[0].vSeries.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar26 = (long)this->par[0].vSeries.super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_finish - (long)pdVar5;
      if (lVar26 != 0) {
        lVar26 = lVar26 >> 3;
        pdVar6 = this->par[1].vSeries.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        dVar3 = this->par[1].fRange[0];
        dVar10 = this->par[1].fRange[1];
        dVar27 = this->par[0].fRange[0];
        dVar29 = this->par[0].fRange[1] - dVar27;
        piVar7 = this->mxHits;
        lVar19 = 0;
        do {
          iVar13 = this->par[0].nCells;
          iVar14 = this->par[1].nCells;
          auVar31._0_8_ = (pdVar6[lVar19] - dVar3) * (double)iVar14;
          auVar31._8_8_ = (pdVar5[lVar19] - dVar27) * (double)iVar13;
          auVar8._8_4_ = SUB84(dVar29,0);
          auVar8._0_8_ = dVar10 - dVar3;
          auVar8._12_4_ = (int)((ulong)dVar29 >> 0x20);
          auVar32 = divpd(auVar31,auVar8);
          iVar11 = (int)auVar32._0_8_;
          iVar30 = (int)auVar32._8_8_;
          iVar25 = iVar30;
          if (iVar13 <= iVar30) {
            iVar25 = iVar13 + -1;
          }
          auVar33._4_4_ = iVar11;
          auVar33._0_4_ = iVar11;
          auVar33._8_4_ = iVar30;
          auVar33._12_4_ = iVar30;
          in_R11D = movmskpd(in_R11D,auVar33);
          iVar13 = 0;
          if ((in_R11D & 2) == 0) {
            iVar13 = iVar25;
          }
          if (iVar14 <= iVar11) {
            iVar11 = iVar14 + -1;
          }
          iVar25 = 0;
          if ((in_R11D & 1) == 0) {
            iVar25 = iVar11;
          }
          iVar25 = iVar13 * iVar14 + iVar25;
          if (piVar7[iVar25] == 0) {
            this->nNonZeroHits = this->nNonZeroHits + 1;
          }
          piVar1 = piVar7 + iVar25;
          *piVar1 = *piVar1 + 1;
          lVar19 = lVar19 + 1;
        } while (lVar26 + (ulong)(lVar26 == 0) != lVar19);
      }
      pcVar21 = NaPetriNode::name(&this->super_NaPetriNode);
      iVar11 = this->par[1].nCells;
      uVar12 = this->nNonZeroHits;
      iVar13 = this->par[0].nCells;
      pNVar22 = NaPetriNode::net(&this->super_NaPetriNode);
      pNVar23 = NaPetriNet::timer(pNVar22);
      uVar15 = (*pNVar23->_vptr_NaTimer[5])(pNVar23);
      NaPrintLog("\'%s\' has %d non-zero cells (%4.1f%%) (at %d)\n",
                 ((double)(int)uVar12 * 100.0) / (double)(iVar11 * iVar13),pcVar21,(ulong)uVar12,
                 (ulong)uVar15);
    }
    else if (uVar24 < uVar18) {
      pNVar16 = NaPetriCnInput::data(this_00);
      iVar13 = (*pNVar16->_vptr_NaVector[8])(pNVar16,0);
      iVar11 = this->par[0].nCells;
      dVar27 = *(double *)CONCAT44(extraout_var_09,iVar13);
      dVar29 = this->par[0].fRange[0];
      dVar3 = this->par[0].fRange[1];
      pNVar16 = NaPetriCnInput::data(this_01);
      iVar14 = (*pNVar16->_vptr_NaVector[8])(pNVar16,0);
      iVar13 = this->par[1].nCells;
      dVar10 = this->par[1].fRange[0];
      auVar34._0_8_ = (*(double *)CONCAT44(extraout_var_10,iVar14) - dVar10) * (double)iVar13;
      auVar34._8_8_ = (dVar27 - dVar29) * (double)iVar11;
      dVar3 = dVar3 - dVar29;
      auVar32._8_4_ = SUB84(dVar3,0);
      auVar32._0_8_ = this->par[1].fRange[1] - dVar10;
      auVar32._12_4_ = (int)((ulong)dVar3 >> 0x20);
      auVar32 = divpd(auVar34,auVar32);
      iVar25 = (int)auVar32._0_8_;
      iVar30 = (int)auVar32._8_8_;
      iVar14 = iVar11 + -1;
      if (iVar30 < iVar11) {
        iVar14 = iVar30;
      }
      auVar9._4_4_ = iVar25;
      auVar9._0_4_ = iVar25;
      auVar9._8_4_ = iVar30;
      auVar9._12_4_ = iVar30;
      uVar12 = movmskpd(iVar30,auVar9);
      if ((uVar12 & 2) != 0) {
        iVar14 = 0;
      }
      iVar11 = iVar13 + -1;
      if (iVar25 < iVar13) {
        iVar11 = iVar25;
      }
      if ((uVar12 & 1) != 0) {
        iVar11 = 0;
      }
      iVar11 = iVar14 * iVar13 + iVar11;
      if (this->mxHits[iVar11] == 0) {
        this->nNonZeroHits = this->nNonZeroHits + 1;
      }
      piVar7 = this->mxHits + iVar11;
      *piVar7 = *piVar7 + 1;
    }
    if (this->fMinHits <=
        ((double)this->nNonZeroHits * 100.0) / (double)(this->par[1].nCells * this->par[0].nCells))
    {
      pNVar16 = NaPetriCnOutput::data(&this->turnoff);
      iVar11 = (*pNVar16->_vptr_NaVector[8])(pNVar16,0);
      *(undefined8 *)CONCAT44(extraout_var_11,iVar11) = 0x3ff0000000000000;
      this->bTurnedOn = false;
      pcVar21 = NaPetriNode::name(&this->super_NaPetriNode);
      iVar11 = this->par[1].nCells;
      uVar12 = this->nNonZeroHits;
      iVar13 = this->par[0].nCells;
      pNVar22 = NaPetriNode::net(&this->super_NaPetriNode);
      pNVar23 = NaPetriNet::timer(pNVar22);
      uVar15 = (*pNVar23->_vptr_NaTimer[5])(pNVar23);
      NaPrintLog("\'%s\' reached %d non-zero cells (%4.1f%%) -> OFF (at %d)\n",
                 ((double)(int)uVar12 * 100.0) / (double)(iVar11 * iVar13),pcVar21,(ulong)uVar12,
                 (ulong)uVar15);
      (*(this->super_NaPetriNode)._vptr_NaPetriNode[5])(this);
      return;
    }
  }
  else {
    iVar11 = NaPetriConnector::links(&(this->turnon).super_NaPetriConnector);
    if (0 < iVar11) {
      pNVar16 = NaPetriCnInput::data(&this->turnon);
      iVar11 = (*pNVar16->_vptr_NaVector[8])(pNVar16,0);
      if ((*(double *)CONCAT44(extraout_var_00,iVar11) != 0.0) ||
         (NAN(*(double *)CONCAT44(extraout_var_00,iVar11)))) {
        this->bTurnedOn = true;
        pcVar21 = NaPetriNode::name(&this->super_NaPetriNode);
        pNVar22 = NaPetriNode::net(&this->super_NaPetriNode);
        pNVar23 = NaPetriNet::timer(pNVar22);
        uVar12 = (*pNVar23->_vptr_NaTimer[5])(pNVar23);
        NaPrintLog("\'%s\' is ON (at %d)\n",pcVar21,(ulong)uVar12);
        if (0 < this->par[1].nCells * this->par[0].nCells) {
          piVar7 = this->mxHits;
          lVar26 = 0;
          do {
            piVar7[lVar26] = 0;
            lVar26 = lVar26 + 1;
          } while (lVar26 < (long)this->par[1].nCells * (long)this->par[0].nCells);
        }
        this->nNonZeroHits = 0;
        this->par[0].fSum = 0.0;
        this->par[0].fSum2 = 0.0;
        this->par[1].fSum = 0.0;
        this->par[1].fSum2 = 0.0;
        pdVar5 = this->par[0].vSeries.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if (this->par[0].vSeries.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish != pdVar5) {
          this->par[0].vSeries.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish = pdVar5;
        }
        pdVar5 = this->par[1].vSeries.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if (this->par[1].vSeries.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish != pdVar5) {
          this->par[1].vSeries.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish = pdVar5;
        }
      }
    }
  }
  return;
}

Assistant:

void
NaPNTrainDataGath::action ()
{
  if(bTurnedOn)
    {
      par[0].vSeries.push_back(in1.data()[0]);
      par[1].vSeries.push_back(in2.data()[0]);
      /*
      NaPrintLog("'%s' gathered data at %d\n",
		 name(), net()->timer().CurrentIndex());
      */
      // Pass data through the node
      out1.data() = in1.data();
      out2.data() = in2.data();
      turnoff.data()[0] = 0;

      out1.commit_data();
      out2.commit_data();

      if(par[0].vSeries.size() < nStDetLen)
	{
	  par[0].fSum += in1.data()[0];
	  par[0].fSum2 += in1.data()[0] * in1.data()[0];

	  par[1].fSum += in2.data()[0];
	  par[1].fSum2 += in2.data()[0] * in2.data()[0];
	}
      else if(par[0].vSeries.size() == nStDetLen)
	{
	  NaPrintLog("'%s' calculated statistics (at %d):\n",
		     name(), net()->timer().CurrentIndex());
	  for(int i = 0; i < 2; ++i)
	    {
	      par[i].fAvg = par[i].fSum / par[i].vSeries.size();
	      par[i].fSigma = sqrt(par[i].fSum2 / par[i].vSeries.size()
				   - par[i].fAvg * par[i].fAvg);
	      par[i].fRange[0] = par[i].fAvg - par[i].fNSigma * par[i].fSigma;
	      par[i].fRange[1] = par[i].fAvg + par[i].fNSigma * par[i].fSigma;
	      NaPrintLog("\taverage=%g\tsigma=%g\trange: %g .. %g\n",
			 par[i].fAvg, par[i].fSigma,
			 par[i].fRange[0], par[i].fRange[1]);
	    }

	  // make classification for previous inputs
	  for(int j = 0; j < par[0].vSeries.size(); ++j)
	    {
	      int	i1 = par[0].cellIndex(par[0].vSeries[j]);
	      int	i2 = par[1].cellIndex(par[1].vSeries[j]);
	      int	i = i1 * par[1].nCells + i2;
	      if(mxHits[i] == 0)
		++nNonZeroHits;
	      ++mxHits[i];
	    }
	  NaPrintLog("'%s' has %d non-zero cells (%4.1f%%) (at %d)\n",
		     name(), nNonZeroHits,
		     100.0 * nNonZeroHits / (par[0].nCells * par[1].nCells),
		     net()->timer().CurrentIndex());
	}
      else if(par[0].vSeries.size() > nStDetLen)
	{
	  int	i1 = par[0].cellIndex(in1.data()[0]);
	  int	i2 = par[1].cellIndex(in2.data()[0]);
	  int	i = i1 * par[1].nCells + i2;
	  if(mxHits[i] == 0)
	    ++nNonZeroHits;
	  ++mxHits[i];
	}

      if(100.0 * nNonZeroHits / (par[0].nCells * par[1].nCells) >= fMinHits)
	{
	  turnoff.data()[0] = 1;
	  bTurnedOn = false;

	  NaPrintLog("'%s' reached %d non-zero cells (%4.1f%%) -> OFF (at %d)\n",
		     name(), nNonZeroHits,
		     100.0 * nNonZeroHits / (par[0].nCells * par[1].nCells),
		     net()->timer().CurrentIndex());
	  halt();
	}
    }
  else if(turnon.links() > 0)
    if(0 != turnon.data()[0])
      {
	bTurnedOn = true;

	NaPrintLog("'%s' is ON (at %d)\n",
		   name(), net()->timer().CurrentIndex());

	for(int i = 0; i < par[0].nCells * par[1].nCells; ++i)
	  mxHits[i] = 0;
	nNonZeroHits = 0;

	par[0].fSum = par[1].fSum = 0.0;
	par[0].fSum2 = par[1].fSum2 = 0.0;

	par[0].vSeries.clear();
	par[1].vSeries.clear();
      }
}